

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O0

void gl4cts::CopyImage::Utils::packPixel
               (GLenum internal_format,GLenum type,GLdouble red,GLdouble green,GLdouble blue,
               GLdouble alpha,GLubyte *out_pixel)

{
  TestError *this;
  GLubyte *out_pixel_local;
  GLdouble alpha_local;
  GLdouble blue_local;
  GLdouble green_local;
  GLdouble red_local;
  GLenum type_local;
  GLenum internal_format_local;
  
  if ((internal_format == 0x2a10) || (internal_format - 0x804f < 6)) goto LAB_00e436ea;
  if (internal_format - 0x8055 < 7) goto LAB_00e4372e;
  if (internal_format - 0x8229 < 2) {
LAB_00e436a4:
    writeChannel(type,0,red,out_pixel);
  }
  else {
    if (1 < internal_format - 0x822b) {
      if (internal_format - 0x822d < 2) goto LAB_00e436a4;
      if (1 < internal_format - 0x822f) {
        if (internal_format - 0x8231 < 6) goto LAB_00e436a4;
        if (5 < internal_format - 0x8237) {
          if (internal_format == 0x8814) {
LAB_00e4372e:
            writeChannel(type,0,red,out_pixel);
            writeChannel(type,1,green,out_pixel);
            writeChannel(type,2,blue,out_pixel);
            writeChannel(type,3,alpha,out_pixel);
            return;
          }
          if (internal_format == 0x8815) {
LAB_00e436ea:
            writeChannel(type,0,red,out_pixel);
            writeChannel(type,1,green,out_pixel);
            writeChannel(type,2,blue,out_pixel);
            return;
          }
          if (internal_format == 0x881a) goto LAB_00e4372e;
          if ((internal_format == 0x881b) || (internal_format == 0x8c3a)) goto LAB_00e436ea;
          if ((internal_format == 0x8c3d) || (internal_format == 0x8d70)) goto LAB_00e4372e;
          if (internal_format == 0x8d71) goto LAB_00e436ea;
          if (internal_format == 0x8d76) goto LAB_00e4372e;
          if (internal_format == 0x8d77) goto LAB_00e436ea;
          if (internal_format == 0x8d7c) goto LAB_00e4372e;
          if (internal_format == 0x8d7d) goto LAB_00e436ea;
          if (internal_format == 0x8d82) goto LAB_00e4372e;
          if (internal_format == 0x8d83) goto LAB_00e436ea;
          if (internal_format == 0x8d88) goto LAB_00e4372e;
          if (internal_format == 0x8d89) goto LAB_00e436ea;
          if (internal_format == 0x8d8e) goto LAB_00e4372e;
          if (internal_format == 0x8d8f) goto LAB_00e436ea;
          if (internal_format == 0x8f94) goto LAB_00e436a4;
          if (internal_format != 0x8f95) {
            if (internal_format == 0x8f96) goto LAB_00e436ea;
            if (internal_format == 0x8f97) goto LAB_00e4372e;
            if (internal_format == 0x8f98) goto LAB_00e436a4;
            if (internal_format != 0x8f99) {
              if (internal_format == 0x8f9a) goto LAB_00e436ea;
              if ((internal_format != 0x8f9b) && (internal_format != 0x906f)) {
                this = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (this,"Invalid enum",(char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cCopyImageTests.cpp"
                           ,0x9cf);
                __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
              }
              goto LAB_00e4372e;
            }
          }
        }
      }
    }
    writeChannel(type,0,red,out_pixel);
    writeChannel(type,1,green,out_pixel);
  }
  return;
}

Assistant:

void Utils::packPixel(GLenum internal_format, GLenum type, GLdouble red, GLdouble green, GLdouble blue, GLdouble alpha,
					  GLubyte* out_pixel)
{
	switch (internal_format)
	{
	case GL_R8:
	case GL_R8_SNORM:
	case GL_R16:
	case GL_R16F:
	case GL_R16_SNORM:
	case GL_R32F:
	case GL_R8I:
	case GL_R8UI:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32I:
	case GL_R32UI:
		writeChannel(type, 0, red, out_pixel);
		break;

	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16_SNORM:
	case GL_RG32F:
	case GL_RG8I:
	case GL_RG8UI:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG32I:
	case GL_RG32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		break;

	case GL_R3_G3_B2:
	case GL_RGB4:
	case GL_RGB5:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB10:
	case GL_R11F_G11F_B10F:
	case GL_RGB12:
	case GL_RGB16:
	case GL_RGB16F:
	case GL_RGB16_SNORM:
	case GL_RGB32F:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB32I:
	case GL_RGB32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		writeChannel(type, 2, blue, out_pixel);
		break;

	case GL_RGB9_E5:
	case GL_RGBA2:
	case GL_RGBA4:
	case GL_RGB5_A1:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_RGB10_A2:
	case GL_RGBA12:
	case GL_RGBA16:
	case GL_RGBA16F:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGB10_A2UI:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA32I:
	case GL_RGBA32UI:
		writeChannel(type, 0, red, out_pixel);
		writeChannel(type, 1, green, out_pixel);
		writeChannel(type, 2, blue, out_pixel);
		writeChannel(type, 3, alpha, out_pixel);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}
}